

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

Module * mocker::allocateRegisters(Module *__return_storage_ptr__,Module *module)

{
  bool bVar1;
  Section *pSVar2;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *plVar3;
  pointer pLVar4;
  char *pcVar5;
  reference p_Var6;
  __normal_iterator<std::_List_const_iterator<mocker::nasm::Line>_*,_std::vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>_>
  local_4d0;
  _List_node_base *local_4c8;
  LineIter local_4c0;
  RegisterAllocator local_4b8;
  _List_const_iterator<mocker::nasm::Line> *local_a8;
  __normal_iterator<std::_List_const_iterator<mocker::nasm::Line>_*,_std::vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>_>
  local_a0;
  __normal_iterator<std::_List_const_iterator<mocker::nasm::Line>_*,_std::vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>_>
  ed;
  iterator iter_1;
  _Self local_88;
  _Self local_80;
  iterator iter;
  vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  funcBegs;
  allocator<char> local_49;
  string local_48;
  Section *local_28;
  Section *text;
  Module *local_18;
  Module *module_local;
  Module *res;
  
  text._7_1_ = 0;
  local_18 = module;
  module_local = __return_storage_ptr__;
  nasm::Module::Module(__return_storage_ptr__,module);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,".text",&local_49);
  pSVar2 = nasm::Module::getSection(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = pSVar2;
  std::
  vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  ::vector((vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
            *)&iter);
  plVar3 = nasm::Section::getLines_abi_cxx11_(local_28);
  local_80._M_node =
       (_List_node_base *)
       std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::begin(plVar3);
  while( true ) {
    plVar3 = nasm::Section::getLines_abi_cxx11_(local_28);
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::end(plVar3);
    bVar1 = std::operator!=(&local_80,&local_88);
    if (!bVar1) break;
    pLVar4 = std::_List_iterator<mocker::nasm::Line>::operator->(&local_80);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pLVar4->inst);
    if (!bVar1) {
      pLVar4 = std::_List_iterator<mocker::nasm::Line>::operator->(&local_80);
      pcVar5 = (char *)std::__cxx11::string::at((ulong)pLVar4);
      if (*pcVar5 != '.') {
        std::
        vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
        ::emplace_back<std::_List_iterator<mocker::nasm::Line>&>
                  ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
                    *)&iter,&local_80);
      }
    }
    std::_List_iterator<mocker::nasm::Line>::operator++(&local_80);
  }
  plVar3 = nasm::Section::getLines_abi_cxx11_(local_28);
  iter_1._M_current =
       (_List_const_iterator<mocker::nasm::Line> *)
       std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::end(plVar3);
  std::
  vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
  ::emplace_back<std::_List_iterator<mocker::nasm::Line>>
            ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
              *)&iter,(_List_iterator<mocker::nasm::Line> *)&iter_1);
  ed._M_current =
       (_List_const_iterator<mocker::nasm::Line> *)
       std::
       vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
       ::begin((vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
                *)&iter);
  local_a8 = (_List_const_iterator<mocker::nasm::Line> *)
             std::
             vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
             ::end((vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
                    *)&iter);
  local_a0 = std::
             prev<__gnu_cxx::__normal_iterator<std::_List_const_iterator<mocker::nasm::Line>*,std::vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>>>
                       ((__normal_iterator<std::_List_const_iterator<mocker::nasm::Line>_*,_std::vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>_>
                         )local_a8,1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&ed,&local_a0);
    pSVar2 = local_28;
    if (!bVar1) break;
    p_Var6 = __gnu_cxx::
             __normal_iterator<std::_List_const_iterator<mocker::nasm::Line>_*,_std::vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>_>
             ::operator*(&ed);
    local_4c0._M_node = p_Var6->_M_node;
    local_4d0 = __gnu_cxx::
                __normal_iterator<std::_List_const_iterator<mocker::nasm::Line>_*,_std::vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>_>
                ::operator+(&ed,1);
    p_Var6 = __gnu_cxx::
             __normal_iterator<std::_List_const_iterator<mocker::nasm::Line>_*,_std::vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>_>
             ::operator*(&local_4d0);
    local_4c8 = p_Var6->_M_node;
    detail::RegisterAllocator::RegisterAllocator(&local_4b8,pSVar2,local_4c0,(LineIter)local_4c8);
    detail::RegisterAllocator::allocate(&local_4b8);
    detail::RegisterAllocator::~RegisterAllocator(&local_4b8);
    __gnu_cxx::
    __normal_iterator<std::_List_const_iterator<mocker::nasm::Line>_*,_std::vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>_>
    ::operator++(&ed);
  }
  text._7_1_ = 1;
  std::
  vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  ::~vector((vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
             *)&iter);
  if ((text._7_1_ & 1) == 0) {
    nasm::Module::~Module(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

nasm::Module allocateRegisters(const nasm::Module &module) {
  auto res = module;
  auto &text = res.getSection(".text");
  std::vector<LineIter> funcBegs;
  for (auto iter = text.getLines().begin(); iter != text.getLines().end();
       ++iter) {
    if (!iter->inst && iter->label.at(0) != '.')
      funcBegs.emplace_back(iter);
  }

  funcBegs.emplace_back(text.getLines().end());
  for (auto iter = funcBegs.begin(), ed = std::prev(funcBegs.end()); iter != ed;
       ++iter) {
    detail::RegisterAllocator(text, *iter, *(iter + 1)).allocate();
  }
  return res;
}